

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cosh.c
# Opt level: O1

double c_cosh(double x)

{
  int iVar1;
  double dVar2;
  
  iVar1 = isnan(x);
  if (iVar1 == 0) {
    dVar2 = -x;
    if (-x <= x) {
      dVar2 = x;
    }
    if (dVar2 <= MAXLOG + LOGE2) {
      if (MAXLOG - LOGE2 <= dVar2) {
        dVar2 = c_exp(dVar2 * 0.5);
        x = dVar2 * 0.5 * dVar2;
      }
      else {
        dVar2 = c_exp(dVar2);
        x = (1.0 / dVar2 + dVar2) * 0.5;
      }
    }
    else {
      mtherr("cosh",3);
      x = INFINITY;
    }
  }
  return x;
}

Assistant:

double c_cosh(x)
double x;
{
double y;

#ifdef NANS
if( isnan(x) )
	return(x);
#endif
if( x < 0 )
	x = -x;
if( x > (MAXLOG + LOGE2) )
	{
	mtherr( "cosh", OVERFLOW );
	return( INFINITY );
	}	
if( x >= (MAXLOG - LOGE2) )
	{
	y = c_exp(0.5 * x);
	y = (0.5 * y) * y;
	return(y);
	}
y = c_exp(x);
y = 0.5 * (y + 1.0 / y);
return( y );
}